

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::FuncImport::~FuncImport(FuncImport *this)

{
  FuncImport *this_local;
  
  ~FuncImport(this);
  operator_delete(this);
  return;
}

Assistant:

explicit FuncImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Func>(), func(name) {}